

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

bool dxil_spv::raw_access_structured_can_vectorize
               (Impl *impl,Type *type,Value *index,uint stride,Value *byte_offset,uint vecsize)

{
  bool bVar1;
  uint addr_shift_log2;
  uint uVar2;
  RawBufferAccessSplit split;
  RawBufferAccessSplit local_48;
  
  if (((vecsize != 3) || ((impl->options).scalar_block_layout != false)) &&
     ((addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl,type),
      ((impl->options).ssbo_alignment - 1 & stride) == 0 ||
      (uVar2 = vecsize << ((byte)addr_shift_log2 & 0x1f), (uVar2 & uVar2 - 1) == 0)))) {
    local_48.scale = 0;
    local_48.bias = 0;
    local_48.dynamic_index = (Value *)0x0;
    bVar1 = extract_raw_buffer_access_split(index,stride,addr_shift_log2,vecsize,&local_48);
    if (bVar1) {
      bVar1 = extract_raw_buffer_access_split(byte_offset,1,addr_shift_log2,vecsize,&local_48);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool raw_access_structured_can_vectorize(
		Converter::Impl &impl, const llvm::Type *type,
		const llvm::Value *index, unsigned stride,
		const llvm::Value *byte_offset,
		unsigned vecsize)
{
	// vec3 vectorization requires scalar block layout always.
	if (!impl.options.scalar_block_layout && vecsize == 3)
		return false;

	unsigned addr_shift_log2 = raw_buffer_data_type_to_addr_shift_log2(impl, type);
	unsigned element_size = (1u << addr_shift_log2) * vecsize;
	unsigned alignment = element_size & -int(element_size);

	// A hypothetical offset buffer must be able to cleanly divide by element_size.
	// If stride aligns properly, we know we will never need offset buffers.
	if ((stride & (impl.options.ssbo_alignment - 1)) != 0)
	{
		// Mostly relevant for vec3 here, where the binding alignment is smaller than element size divider.
		if (element_size > alignment)
			return false;
	}

	RawBufferAccessSplit split = {};
	return extract_raw_buffer_access_split(index, stride, addr_shift_log2, vecsize, split) &&
	       extract_raw_buffer_access_split(byte_offset, 1, addr_shift_log2, vecsize, split);
}